

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O0

int __thiscall CNet::GetLength(CNet *this,int iMode,int iValue)

{
  CWire *pCVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  reference ppCVar5;
  CLayer *this_00;
  CLayer *pLayer;
  CWire *pWire_2;
  iterator end_2;
  iterator itr_2;
  CWire *pWire_1;
  iterator end_1;
  iterator itr_1;
  CWire *pWire;
  iterator end;
  iterator itr;
  int iLength;
  int iValue_local;
  int iMode_local;
  CNet *this_local;
  
  iVar3 = IsLocal(this);
  if (iVar3 == 0) {
    itr._M_current._4_4_ = 0;
    if (iMode == 0) {
      end = std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&this->m_Wire);
      pWire = (CWire *)std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&this->m_Wire);
      while (bVar2 = __gnu_cxx::operator!=
                               (&end,(__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>
                                      *)&pWire), bVar2) {
        ppCVar5 = __gnu_cxx::
                  __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                  operator*(&end);
        pCVar1 = *ppCVar5;
        uVar4 = CObject::GetProp(&pCVar1->super_CObject);
        if ((uVar4 & iValue) != 0) {
          iVar3 = CWire::GetLength(pCVar1);
          itr._M_current._4_4_ = iVar3 + itr._M_current._4_4_;
        }
        __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
        operator++(&end);
      }
    }
    else if (iMode == 1) {
      end_1 = std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&this->m_Wire);
      pWire_1 = (CWire *)std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&this->m_Wire);
      while (bVar2 = __gnu_cxx::operator!=
                               (&end_1,(__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>
                                        *)&pWire_1), bVar2) {
        ppCVar5 = __gnu_cxx::
                  __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                  operator*(&end_1);
        pCVar1 = *ppCVar5;
        uVar4 = CObject::GetState(&pCVar1->super_CObject);
        if ((uVar4 & iValue) != 0) {
          iVar3 = CWire::GetLength(pCVar1);
          itr._M_current._4_4_ = iVar3 + itr._M_current._4_4_;
        }
        __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
        operator++(&end_1);
      }
    }
    else {
      if (iMode != 0x100000) {
        __assert_fail("FALSE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                      ,0xad,"int CNet::GetLength(int, int)");
      }
      end_2 = std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&this->m_Wire);
      pWire_2 = (CWire *)std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&this->m_Wire);
      while (bVar2 = __gnu_cxx::operator!=
                               (&end_2,(__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>
                                        *)&pWire_2), bVar2) {
        ppCVar5 = __gnu_cxx::
                  __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                  operator*(&end_2);
        pCVar1 = *ppCVar5;
        this_00 = CWire::GetLayer(pCVar1);
        if ((this_00 != (CLayer *)0x0) && (iVar3 = CLayer::Z(this_00), iVar3 == iValue)) {
          iVar3 = CWire::GetLength(pCVar1);
          itr._M_current._4_4_ = iVar3 + itr._M_current._4_4_;
        }
        __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
        operator++(&end_2);
      }
    }
    this_local._4_4_ = itr._M_current._4_4_;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int CNet::GetLength(int iMode, int iValue)
{
	if(IsLocal())	return	0;
	
	int	iLength	=	0;
	switch(iMode) {
	case GET_MODE_PROP:
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			if(pWire->GetProp()&iValue)	iLength	+=	pWire->GetLength();
		}
		break;
	case GET_MODE_STATE:
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			if(pWire->GetState()&iValue)	iLength	+=	pWire->GetLength();
		}
		break;
	case GET_MODE_LAYER:
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			CLayer*	pLayer	=	pWire->GetLayer();

			if(pLayer&&pLayer->Z()==iValue)	iLength	+=	pWire->GetLength();
		}
		break;
	default:
		assert(FALSE);
		break;
	}

	return	iLength;
}